

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O1

int main(void)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  N_Vector p_Var4;
  N_Vector p_Var5;
  long *plVar6;
  long lVar7;
  undefined8 *puVar8;
  UserData paVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  void *mem;
  SUNContext ctx;
  sunrealtype tret;
  void *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  UserData local_c8;
  N_Vector local_c0;
  N_Vector local_b8;
  double local_b0;
  double local_a8;
  sunrealtype *local_a0;
  long *local_98;
  long *local_90;
  double local_88;
  double local_80;
  double local_78;
  long local_70;
  undefined8 *local_68;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar2 = SUNContext_Create(0,&local_d8);
  if ((int)uVar2 < 0) {
    pcVar11 = "SUNContext_Create";
  }
  else {
    plVar3 = (long *)N_VNew_Serial(10,local_d8);
    p_Var4 = (N_Vector)N_VClone(plVar3);
    p_Var5 = (N_Vector)N_VClone(plVar3);
    plVar6 = (long *)N_VNew_Serial(1,local_d8);
    local_60 = N_VCloneVectorArray(2,p_Var4);
    lVar7 = N_VCloneVectorArray(2,p_Var5);
    local_98 = plVar6;
    puVar8 = (undefined8 *)N_VCloneVectorArray(2,plVar6);
    paVar9 = (UserData)malloc(0x48);
    paVar9->a = 0.5;
    paVar9->J1 = 1.0;
    paVar9->J2 = 2.0;
    paVar9->m1 = 1.0;
    local_a0 = paVar9->params;
    paVar9->params[0] = 1.0;
    paVar9->params[1] = 1.0;
    paVar9->m2 = 1.0;
    paVar9->l0 = 1.0;
    paVar9->F = 1.0;
    N_VConst(0,plVar3);
    lVar1 = local_60;
    lVar12 = *(long *)(*plVar3 + 0x10);
    *(undefined8 *)(lVar12 + 0x40) = 0;
    *(undefined8 *)(lVar12 + 0x48) = 0;
    *(undefined8 *)(lVar12 + 0x30) = 0;
    *(undefined8 *)(lVar12 + 0x38) = 0;
    local_90 = plVar3;
    puts("\nSlider-Crank example for IDAS:");
    local_c8 = paVar9;
    local_c0 = p_Var5;
    local_b8 = p_Var4;
    setIC(p_Var4,p_Var5,paVar9);
    lVar12 = 0;
    do {
      N_VConst(0,*(undefined8 *)(lVar1 + lVar12 * 8));
      N_VConst(0,*(undefined8 *)(lVar7 + lVar12 * 8));
      lVar12 = lVar12 + 1;
    } while (lVar12 == 1);
    local_e0 = (void *)IDACreate(local_d8);
    p_Var4 = local_b8;
    IDAInit(0,local_e0,ressc,local_b8,local_c0);
    IDASStolerances(0xa0b5ed8d,0x3e7ad7f29abcaf48,local_e0);
    IDASetUserData(local_e0,local_c8);
    IDASetId(local_e0,local_90);
    IDASetSuppressAlg(local_e0,1);
    IDASetMaxNumSteps(local_e0,20000);
    lVar12 = SUNDenseMatrix(10,10,local_d8);
    if (lVar12 == 0) {
      main_cold_4();
      return 1;
    }
    lVar10 = SUNLinSol_Dense(p_Var4,lVar12,local_d8);
    if (lVar10 == 0) {
      main_cold_3();
      return 1;
    }
    uVar2 = IDASetLinearSolver(local_e0,lVar10,lVar12);
    if (-1 < (int)uVar2) {
      lVar13 = 0;
      local_b0 = (double)lVar10;
      local_a8 = (double)lVar12;
      IDASensInit(local_e0,2,1,0,lVar1,lVar7);
      local_48 = *(undefined4 *)local_a0;
      uStack_44 = *(undefined4 *)((long)local_a0 + 4);
      uStack_40 = *(undefined4 *)(local_a0 + 1);
      uStack_3c = *(undefined4 *)((long)local_a0 + 0xc);
      IDASetSensParams(local_e0,local_a0,&local_48,0);
      IDASensEEtolerances(local_e0);
      IDASetSensErrCon(local_e0,1);
      plVar3 = local_98;
      N_VConst(0,local_98);
      IDAQuadInit(local_e0,rhsQ,plVar3);
      IDAQuadSStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,local_e0);
      IDASetQuadErrCon(local_e0,1);
      do {
        N_VConst(0,puVar8[lVar13]);
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      IDAQuadSensInit(local_e0,rhsQS,puVar8);
      local_58 = 0x3e45798ee2308c3a;
      uStack_50 = 0x3e45798ee2308c3a;
      IDAQuadSensSStolerances(0xa0b5ed8d,local_e0);
      IDASetQuadSensErrCon(local_e0,1);
      printf("\nForward integration ... ");
      uVar2 = IDASolve(0,local_e0,local_d0,local_b8,local_c0,1);
      if ((int)uVar2 < 0) {
        pcVar11 = "IDASolve";
LAB_00102fcd:
        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar11,(ulong)uVar2);
        return 1;
      }
      puts("done!");
      uVar2 = PrintFinalStats(local_e0);
      plVar3 = local_98;
      if ((int)uVar2 < 0) {
        pcVar11 = "PrintFinalStats";
        goto LAB_00102fcd;
      }
      IDAGetQuad(local_e0,local_d0,local_98);
      puts("--------------------------------------------");
      printf("  G = %24.16f\n",(int)**(undefined8 **)(*plVar3 + 0x10));
      puts("--------------------------------------------\n");
      IDAGetQuadSens(local_e0,local_d0,puVar8);
      puts("-------------F O R W A R D------------------");
      printf("   dG/dp:  %12.4e %12.4e\n",(int)**(undefined8 **)(*(long *)*puVar8 + 0x10),
             **(undefined8 **)(*(long *)puVar8[1] + 0x10));
      puts("--------------------------------------------\n");
      IDAFree(&local_e0);
      SUNLinSolFree(local_b0);
      SUNMatDestroy(local_a8);
      paVar9 = local_c8;
      *(undefined4 *)local_c8->params = 0;
      *(undefined4 *)((long)local_c8->params + 4) = 0x3ff00000;
      *(undefined4 *)(local_c8->params + 1) = 0;
      *(undefined4 *)((long)local_c8->params + 0xc) = 0x3ff00000;
      local_e0 = (void *)IDACreate(local_d8);
      p_Var5 = local_b8;
      p_Var4 = local_c0;
      setIC(local_b8,local_c0,paVar9);
      IDAInit(0,local_e0,ressc,p_Var5,p_Var4);
      IDASStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,local_e0);
      IDASetUserData(local_e0,paVar9);
      IDASetId(local_e0,local_90);
      IDASetSuppressAlg(local_e0,1);
      lVar12 = SUNDenseMatrix(10,10,local_d8);
      if (lVar12 == 0) {
        main_cold_2();
        return 1;
      }
      local_a0 = (sunrealtype *)SUNLinSol_Dense(p_Var5,lVar12,local_d8);
      if (local_a0 == (sunrealtype *)0x0) {
        main_cold_1();
        return 1;
      }
      uVar2 = IDASetLinearSolver(local_e0,local_a0,lVar12);
      plVar3 = local_98;
      if (-1 < (int)uVar2) {
        local_68 = puVar8;
        N_VConst(0,local_98);
        IDAQuadInit(local_e0,rhsQ,plVar3);
        IDAQuadSStolerances(0xa0b5ed8d,0x3e45798ee2308c3a,local_e0);
        IDASetQuadErrCon(local_e0,1);
        p_Var4 = local_c0;
        local_70 = lVar12;
        IDASolve(0,local_e0,local_d0,p_Var5,local_c0,1);
        IDAGetQuad(local_e0,local_d0,plVar3);
        paVar9 = local_c8;
        local_b0 = **(double **)(*plVar3 + 0x10);
        local_c8->params[0] = local_c8->params[0] + -1e-05;
        setIC(p_Var5,p_Var4,local_c8);
        IDAReInit(0,local_e0,p_Var5,p_Var4);
        N_VConst(0,plVar3);
        IDAQuadReInit(local_e0,plVar3);
        p_Var5 = local_b8;
        IDASolve(0,local_e0,local_d0,local_b8,p_Var4,1);
        plVar3 = local_98;
        IDAGetQuad(local_e0,local_d0,local_98);
        local_a8 = **(double **)(*plVar3 + 0x10);
        paVar9->params[0] = paVar9->params[0] + 2e-05;
        setIC(p_Var5,p_Var4,paVar9);
        IDAReInit(0,local_e0,p_Var5,p_Var4);
        N_VConst(0,plVar3);
        IDAQuadReInit(local_e0,plVar3);
        p_Var4 = local_c0;
        IDASolve(0,local_e0,local_d0,p_Var5,local_c0,1);
        IDAGetQuad(local_e0,local_d0,plVar3);
        local_78 = **(double **)(*plVar3 + 0x10);
        paVar9->params[0] = 1.0;
        paVar9->params[1] = paVar9->params[1] + -1e-05;
        setIC(p_Var5,p_Var4,paVar9);
        IDAReInit(0,local_e0,p_Var5,p_Var4);
        N_VConst(0,plVar3);
        IDAQuadReInit(local_e0,plVar3);
        IDASolve(0,local_e0,local_d0,p_Var5,p_Var4,1);
        IDAGetQuad(local_e0,local_d0,plVar3);
        local_80 = **(double **)(*plVar3 + 0x10);
        local_c8->params[1] = local_c8->params[1] + 2e-05;
        setIC(p_Var5,p_Var4,local_c8);
        IDAReInit(0,local_e0,p_Var5,p_Var4);
        N_VConst(0,plVar3);
        IDAQuadReInit(local_e0,plVar3);
        IDASolve(0,local_e0,local_d0,p_Var5,p_Var4,1);
        IDAGetQuad(local_e0,local_d0,plVar3);
        local_88 = **(double **)(*plVar3 + 0x10);
        IDAFree(&local_e0);
        SUNLinSolFree(local_a0);
        SUNMatDestroy(local_70);
        puts("\n\n   Checking using Finite Differences \n");
        puts("---------------BACKWARD------------------");
        printf("   dG/dp:  %12.4e %12.4e\n",SUB84((local_b0 - local_a8) / 1e-05,0),
               (local_b0 - local_80) / 1e-05);
        puts("-----------------------------------------\n");
        puts("---------------FORWARD-------------------");
        printf("   dG/dp:  %12.4e %12.4e\n",SUB84((local_78 - local_b0) / 1e-05,0),
               (local_88 - local_b0) / 1e-05);
        puts("-----------------------------------------\n");
        puts("--------------CENTERED-------------------");
        printf("   dG/dp:  %12.4e %12.4e\n",SUB84((local_78 - local_a8) / 2e-05,0),
               (local_88 - local_80) / 2e-05);
        puts("-----------------------------------------\n");
        free(local_c8);
        N_VDestroy(local_90);
        N_VDestroy(local_b8);
        N_VDestroy(p_Var4);
        N_VDestroy(plVar3);
        N_VDestroyVectorArray(lVar1,2);
        N_VDestroyVectorArray(lVar7,2);
        N_VDestroyVectorArray(local_68,2);
        SUNContext_Free(&local_d8);
        return 0;
      }
    }
    pcVar11 = "IDASetLinearSolver";
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar11,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  UserData data;

  void* mem;
  N_Vector yy, yp, id, q, *yyS, *ypS, *qS;
  sunrealtype tret;
  sunrealtype pbar[2];
  sunrealtype dp, G, Gm[2], Gp[2];
  int retval, is;
  sunrealtype atolS[NP];
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  A  = NULL;
  LS = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  id = N_VNew_Serial(NEQ, ctx);
  yy = N_VClone(id);
  yp = N_VClone(id);
  q  = N_VNew_Serial(1, ctx);

  yyS = N_VCloneVectorArray(NP, yy);
  ypS = N_VCloneVectorArray(NP, yp);
  qS  = N_VCloneVectorArray(NP, q);

  data = (UserData)malloc(sizeof *data);

  data->a         = 0.5; /* half-length of crank */
  data->J1        = 1.0; /* crank moment of inertia */
  data->m2        = 1.0; /* mass of connecting rod */
  data->m1        = 1.0;
  data->J2        = 2.0; /* moment of inertia of connecting rod */
  data->params[0] = 1.0; /* spring constant */
  data->params[1] = 1.0; /* damper constant */
  data->l0        = 1.0; /* spring free length */
  data->F         = 1.0; /* external constant force */

  N_VConst(ONE, id);
  NV_Ith_S(id, 9) = ZERO;
  NV_Ith_S(id, 8) = ZERO;
  NV_Ith_S(id, 7) = ZERO;
  NV_Ith_S(id, 6) = ZERO;

  printf("\nSlider-Crank example for IDAS:\n");

  /* Consistent IC*/
  setIC(yy, yp, data);

  for (is = 0; is < NP; is++)
  {
    N_VConst(ZERO, yyS[is]);
    N_VConst(ZERO, ypS[is]);
  }

  /* IDA initialization */
  mem    = IDACreate(ctx);
  retval = IDAInit(mem, ressc, TBEGIN, yy, yp);
  retval = IDASStolerances(mem, RTOLF, ATOLF);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);
  retval = IDASetMaxNumSteps(mem, 20000);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval  = IDASensInit(mem, NP, IDA_SIMULTANEOUS, NULL, yyS, ypS);
  pbar[0] = data->params[0];
  pbar[1] = data->params[1];
  retval  = IDASetSensParams(mem, data->params, pbar, NULL);
  retval  = IDASensEEtolerances(mem);
  IDASetSensErrCon(mem, SUNTRUE);

  N_VConst(ZERO, q);
  retval = IDAQuadInit(mem, rhsQ, q);
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  retval = IDASetQuadErrCon(mem, SUNTRUE);

  for (is = 0; is < NP; is++) { N_VConst(ZERO, qS[is]); }
  retval   = IDAQuadSensInit(mem, rhsQS, qS);
  atolS[0] = atolS[1] = ATOLQ;
  retval              = IDAQuadSensSStolerances(mem, RTOLQ, atolS);
  retval              = IDASetQuadSensErrCon(mem, SUNTRUE);

  /* Perform forward run */
  printf("\nForward integration ... ");

  retval = IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  if (check_retval(&retval, "IDASolve", 1)) { return (1); }

  printf("done!\n");

  retval = PrintFinalStats(mem);
  if (check_retval(&retval, "PrintFinalStats", 1)) { return (1); }

  IDAGetQuad(mem, &tret, q);
  printf("--------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  G = %24.16Lf\n", Ith(q, 1));
#else
  printf("  G = %24.16f\n", Ith(q, 1));
#endif
  printf("--------------------------------------------\n\n");

  IDAGetQuadSens(mem, &tret, qS);
  printf("-------------F O R W A R D------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(qS[0], 1), Ith(qS[1], 1));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(qS[0], 1), Ith(qS[1], 1));
#endif
  printf("--------------------------------------------\n\n");

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  /* Finite differences for dG/dp */
  dp              = 0.00001;
  data->params[0] = ONE;
  data->params[1] = ONE;

  mem = IDACreate(ctx);

  setIC(yy, yp, data);
  retval = IDAInit(mem, ressc, TBEGIN, yy, yp);
  retval = IDASStolerances(mem, RTOLFD, ATOLFD);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  N_VConst(ZERO, q);
  IDAQuadInit(mem, rhsQ, q);
  IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  IDASetQuadErrCon(mem, SUNTRUE);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);

  IDAGetQuad(mem, &tret, q);
  G = Ith(q, 1);
  /*printf("  G  =%12.6e\n", Ith(q,1));*/

  /******************************
  * BACKWARD for k
  ******************************/
  data->params[0] -= dp;
  setIC(yy, yp, data);

  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gm[0] = Ith(q, 1);
  /*printf("Gm[0]=%12.6e\n", Ith(q,1));*/

  /****************************
  * FORWARD for k *
  ****************************/
  data->params[0] += (TWO * dp);
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gp[0] = Ith(q, 1);
  /*printf("Gp[0]=%12.6e\n", Ith(q,1));*/

  /* Backward for c */
  data->params[0] = ONE;
  data->params[1] -= dp;
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gm[1] = Ith(q, 1);

  /* Forward for c */
  data->params[1] += (TWO * dp);
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gp[1] = Ith(q, 1);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  printf("\n\n   Checking using Finite Differences \n\n");

  printf("---------------BACKWARD------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (G - Gm[0]) / dp, (G - Gm[1]) / dp);
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (G - Gm[0]) / dp, (G - Gm[1]) / dp);
#endif
  printf("-----------------------------------------\n\n");

  printf("---------------FORWARD-------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (Gp[0] - G) / dp, (Gp[1] - G) / dp);
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (Gp[0] - G) / dp, (Gp[1] - G) / dp);
#endif
  printf("-----------------------------------------\n\n");

  printf("--------------CENTERED-------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (Gp[0] - Gm[0]) / (TWO * dp),
         (Gp[1] - Gm[1]) / (TWO * dp));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (Gp[0] - Gm[0]) / (TWO * dp),
         (Gp[1] - Gm[1]) / (TWO * dp));
#endif
  printf("-----------------------------------------\n\n");

  /* Free memory */
  free(data);

  N_VDestroy(id);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);

  N_VDestroyVectorArray(yyS, NP);
  N_VDestroyVectorArray(ypS, NP);
  N_VDestroyVectorArray(qS, NP);

  SUNContext_Free(&ctx);

  return (0);
}